

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handle_append_entries.cxx
# Opt level: O2

bool __thiscall nuraft::raft_server::request_append_entries(raft_server *this,ptr<peer> *p)

{
  atomic<int> *paVar1;
  element_type *peVar2;
  __int_type _Var3;
  element_type *peVar4;
  peer *this_00;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined8 uVar7;
  bool bVar8;
  ReturnCode RVar9;
  int32 iVar10;
  int iVar11;
  size_t sVar12;
  size_t sVar13;
  uint64_t uVar14;
  ulong uVar15;
  element_type *peVar16;
  snapshot_io_mgr *psVar17;
  ptr<raft_params> clone;
  undefined1 local_c8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_b8;
  ptr<req_msg> msg;
  ptr<raft_params> params;
  __shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2> local_88;
  __shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2> local_78;
  Param param;
  Param cb_param;
  
  if ((request_append_entries(std::shared_ptr<nuraft::peer>)::chk_timer == '\0') &&
     (iVar11 = __cxa_guard_acquire(&request_append_entries(std::shared_ptr<nuraft::peer>)::chk_timer
                                  ), iVar11 != 0)) {
    timer_helper::timer_helper(&request_append_entries::chk_timer,1000000,false);
    __cxa_guard_release(&request_append_entries(std::shared_ptr<nuraft::peer>)::chk_timer);
  }
  if ((this->role_)._M_i != leader) {
    return false;
  }
  cb_param.myId = this->id_;
  cb_param.leaderId = (this->leader_).super___atomic_base<int>._M_i;
  cb_param.peerId =
       ((((p->super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->config_).
        super___shared_ptr<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->id_;
  cb_param.ctx = (void *)0x0;
  RVar9 = cb_func::call(&((this->ctx_)._M_t.
                          super___uniq_ptr_impl<nuraft::context,_std::default_delete<nuraft::context>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_nuraft::context_*,_std::default_delete<nuraft::context>_>
                          .super__Head_base<0UL,_nuraft::context_*,_false>._M_head_impl)->cb_func_,
                        RequestAppendEntries,&cb_param);
  if (RVar9 == ReturnNull) {
    peVar2 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    if (peVar2 == (element_type *)0x0) {
      return true;
    }
    iVar11 = (*peVar2->_vptr_logger[7])();
    if (iVar11 < 3) {
      return true;
    }
    peVar2 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    msg_if_given_abi_cxx11_((string *)&clone,"by callback, abort request_append_entries");
    (*peVar2->_vptr_logger[8])
              (peVar2,3,
               "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_append_entries.cxx"
               ,"request_append_entries",0x9a,&clone);
    std::__cxx11::string::~string((string *)&clone);
    return true;
  }
  context::get_params((context *)&params);
  if ((((params.super___shared_ptr<nuraft::raft_params,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
        auto_adjust_quorum_for_small_cluster_ == true) &&
      (iVar10 = get_num_voting_members(this), iVar10 == 2)) &&
     (bVar8 = timer_helper::timeout_and_reset(&request_append_entries::chk_timer), bVar8)) {
    sVar12 = get_not_responding_peers(this);
    iVar10 = get_quorum_for_commit(this);
    sVar13 = get_num_stale_peers(this);
    if (iVar10 == 0) {
      if ((sVar13 != 0 || sVar12 != 0) ||
         ((params.super___shared_ptr<nuraft::raft_params,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
          custom_commit_quorum_size_ != 1)) goto LAB_0015cb40;
      peVar2 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      if ((peVar2 != (element_type *)0x0) && (iVar11 = (*peVar2->_vptr_logger[7])(), 2 < iVar11)) {
        peVar2 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        msg_if_given_abi_cxx11_
                  ((string *)&clone,
                   "2-node cluster\'s follower is responding now, restore quorum with default value"
                  );
        (*peVar2->_vptr_logger[8])
                  (peVar2,3,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_append_entries.cxx"
                   ,"request_append_entries",0xbf,&clone);
        std::__cxx11::string::~string((string *)&clone);
      }
      std::make_shared<nuraft::raft_params,nuraft::raft_params&>((raft_params *)&clone);
      (clone.super___shared_ptr<nuraft::raft_params,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
      custom_commit_quorum_size_ = 0;
      (clone.super___shared_ptr<nuraft::raft_params,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
      custom_election_quorum_size_ = 0;
      context::set_params((this->ctx_)._M_t.
                          super___uniq_ptr_impl<nuraft::context,_std::default_delete<nuraft::context>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_nuraft::context_*,_std::default_delete<nuraft::context>_>
                          .super__Head_base<0UL,_nuraft::context_*,_false>._M_head_impl,&clone);
    }
    else {
      if (sVar12 == 0) {
        if (sVar13 == 0) goto LAB_0015cb40;
        peVar2 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        if ((peVar2 != (element_type *)0x0) && (iVar11 = (*peVar2->_vptr_logger[7])(), 2 < iVar11))
        {
          peVar2 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          msg_if_given_abi_cxx11_
                    ((string *)&clone,
                     "2-node cluster\'s follower is lagging behind, adjust quorum to 1");
          (*peVar2->_vptr_logger[8])
                    (peVar2,3,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_append_entries.cxx"
                     ,"request_append_entries",0xb0,&clone);
          goto LAB_0015cb01;
        }
      }
      else {
        peVar2 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        if ((peVar2 != (element_type *)0x0) && (iVar11 = (*peVar2->_vptr_logger[7])(), 2 < iVar11))
        {
          peVar2 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          msg_if_given_abi_cxx11_
                    ((string *)&clone,
                     "2-node cluster\'s follower is not responding long time, adjust quorum to 1");
          (*peVar2->_vptr_logger[8])
                    (peVar2,3,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_append_entries.cxx"
                     ,"request_append_entries",0xac,&clone);
LAB_0015cb01:
          std::__cxx11::string::~string((string *)&clone);
        }
      }
      std::make_shared<nuraft::raft_params,nuraft::raft_params&>((raft_params *)&clone);
      (clone.super___shared_ptr<nuraft::raft_params,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
      custom_commit_quorum_size_ = 1;
      (clone.super___shared_ptr<nuraft::raft_params,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
      custom_election_quorum_size_ = 1;
      context::set_params((this->ctx_)._M_t.
                          super___uniq_ptr_impl<nuraft::context,_std::default_delete<nuraft::context>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_nuraft::context_*,_std::default_delete<nuraft::context>_>
                          .super__Head_base<0UL,_nuraft::context_*,_false>._M_head_impl,&clone);
    }
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&clone.super___shared_ptr<nuraft::raft_params,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
  }
LAB_0015cb40:
  bVar8 = peer::need_to_reconnect
                    ((p->super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>)._M_ptr);
  uVar14 = timer_helper::get_us
                     (&((p->super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
                       last_active_timer_);
  auVar5._8_8_ = 0;
  auVar5._0_8_ = uVar14;
  uVar15 = SUB168(auVar5 / ZEXT816(1000),0);
  if (DAT_001c3530 *
      (params.super___shared_ptr<nuraft::raft_params,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
      heart_beat_interval_ < SUB164(auVar5 / ZEXT816(1000),0)) {
    peVar16 = (this->srv_to_leave_).super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr;
    if ((peVar16 != (element_type *)0x0) &&
       (((peVar16->config_).super___shared_ptr<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2>.
        _M_ptr)->id_ ==
        ((((p->super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->config_).
         super___shared_ptr<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->id_)) {
      peVar2 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      if ((peVar2 != (element_type *)0x0) && (iVar11 = (*peVar2->_vptr_logger[7])(), 2 < iVar11)) {
        peVar2 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        msg_if_given_abi_cxx11_
                  ((string *)&clone,
                   "connection to peer %d is not active long time: %d ms, but this peer should be removed. do nothing"
                   ,(ulong)(uint)((((p->super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>
                                    )._M_ptr)->config_).
                                  super___shared_ptr<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2>
                                 ._M_ptr)->id_,uVar15 & 0xffffffff);
        (*peVar2->_vptr_logger[8])
                  (peVar2,3,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_append_entries.cxx"
                   ,"request_append_entries",0xd3,&clone);
        std::__cxx11::string::~string((string *)&clone);
      }
      goto LAB_0015cc02;
    }
    peVar2 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    if ((peVar2 != (element_type *)0x0) && (iVar11 = (*peVar2->_vptr_logger[7])(), 2 < iVar11)) {
      peVar2 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      msg_if_given_abi_cxx11_
                ((string *)&clone,
                 "connection to peer %d is not active long time: %d ms, force re-connect",
                 (ulong)(uint)((((p->super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>).
                                _M_ptr)->config_).
                               super___shared_ptr<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2>.
                              _M_ptr)->id_,uVar15 & 0xffffffff);
      (*peVar2->_vptr_logger[8])
                (peVar2,3,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_append_entries.cxx"
                 ,"request_append_entries",0xd8,&clone);
      std::__cxx11::string::~string((string *)&clone);
    }
    timer_helper::reset(&((p->super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)
                         ->last_active_timer_);
LAB_0015cc7f:
    bVar8 = reconnect_client(this,(p->super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>).
                                  _M_ptr);
    _Var3 = (((p->super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
            next_log_idx_).super___atomic_base<unsigned_long>._M_i;
    if (bVar8 && _Var3 != 0) {
      peVar2 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      if ((peVar2 != (element_type *)0x0) && (iVar11 = (*peVar2->_vptr_logger[7])(), 5 < iVar11)) {
        peVar2 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        peVar16 = (p->super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
        msg_if_given_abi_cxx11_
                  ((string *)&clone,
                   "new rpc for peer %d is created, reset next log idx (%lu) and matched log idx (%lu)"
                   ,(ulong)(uint)((peVar16->config_).
                                  super___shared_ptr<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2>
                                 ._M_ptr)->id_,_Var3,peVar16->matched_idx_);
        (*peVar2->_vptr_logger[8])
                  (peVar2,6,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_append_entries.cxx"
                   ,"request_append_entries",0xf6,&clone);
        std::__cxx11::string::~string((string *)&clone);
      }
      LOCK();
      (((p->super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->next_log_idx_).
      super___atomic_base<unsigned_long>._M_i = 0;
      UNLOCK();
      peVar16 = (p->super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      peVar16->matched_idx_ = 0;
    }
    else {
      peVar16 = (p->super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    }
    LOCK();
    (peVar16->reconn_scheduled_)._M_base._M_i = false;
    UNLOCK();
  }
  else {
LAB_0015cc02:
    if (bVar8) goto LAB_0015cc7f;
  }
  if ((params.super___shared_ptr<nuraft::raft_params,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
      use_bg_thread_for_snapshot_io_ == true) {
    psVar17 = snapshot_io_mgr::instance();
    bVar8 = snapshot_io_mgr::has_pending_request
                      (psVar17,this,
                       ((((p->super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)
                        ->config_).
                        super___shared_ptr<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                       id_);
    if (bVar8) {
      peVar2 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      bVar8 = true;
      if ((peVar2 != (element_type *)0x0) && (iVar11 = (*peVar2->_vptr_logger[7])(), 5 < iVar11)) {
        peVar2 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        msg_if_given_abi_cxx11_
                  ((string *)&clone,"previous snapshot request for peer %d already exists",
                   (ulong)(uint)((((p->super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>)
                                  ._M_ptr)->config_).
                                 super___shared_ptr<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2>.
                                _M_ptr)->id_);
        (*peVar2->_vptr_logger[8])
                  (peVar2,6,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_append_entries.cxx"
                   ,"request_append_entries",0x101,&clone);
        std::__cxx11::string::~string((string *)&clone);
      }
      goto LAB_0015d40d;
    }
  }
  bVar8 = peer::make_busy((p->super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>)._M_ptr);
  peVar2 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (!bVar8) {
    if ((peVar2 != (element_type *)0x0) && (iVar11 = (*peVar2->_vptr_logger[7])(), 4 < iVar11)) {
      peVar2 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      msg_if_given_abi_cxx11_
                ((string *)&clone,"Server %d is busy, skip the request",
                 (ulong)(uint)((((p->super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>).
                                _M_ptr)->config_).
                               super___shared_ptr<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2>.
                              _M_ptr)->id_);
      (*peVar2->_vptr_logger[8])
                (peVar2,5,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_append_entries.cxx"
                 ,"request_append_entries",0x15a,&clone);
      std::__cxx11::string::~string((string *)&clone);
    }
    std::__shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_88,&p->super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>);
    check_snapshot_timeout(this,(ptr<peer> *)&local_88);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_88._M_refcount);
    uVar14 = timer_helper::get_us
                       (&((p->super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)
                         ->last_sent_timer_);
    bVar8 = false;
    auVar6._8_8_ = 0;
    auVar6._0_8_ = uVar14;
    if (SUB164(auVar6 / ZEXT816(1000),0) <=
        (params.super___shared_ptr<nuraft::raft_params,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
        heart_beat_interval_) goto LAB_0015d40d;
    LOCK();
    paVar1 = &((p->super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
              long_pause_warnings_;
    (paVar1->super___atomic_base<int>)._M_i = (paVar1->super___atomic_base<int>)._M_i + 1;
    UNLOCK();
    if ((((p->super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
        long_pause_warnings_).super___atomic_base<int>._M_i < DAT_001c3524) {
      peVar2 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      if ((peVar2 != (element_type *)0x0) && (iVar11 = (*peVar2->_vptr_logger[7])(), 2 < iVar11)) {
        peVar2 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        msg_if_given_abi_cxx11_
                  ((string *)&clone,
                   "skipped sending msg to %d too long time, last msg sent %d ms ago",
                   (ulong)(uint)((((p->super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>)
                                  ._M_ptr)->config_).
                                 super___shared_ptr<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2>.
                                _M_ptr)->id_,SUB168(auVar6 / ZEXT816(1000),0) & 0xffffffff);
        (*peVar2->_vptr_logger[8])
                  (peVar2,3,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_append_entries.cxx"
                   ,"request_append_entries",0x164,&clone);
LAB_0015d402:
        std::__cxx11::string::~string((string *)&clone);
      }
    }
    else if ((((((p->super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
               long_pause_warnings_).super___atomic_base<int>._M_i == DAT_001c3524) &&
             (peVar2 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr, peVar2 != (element_type *)0x0)) &&
            (iVar11 = (*peVar2->_vptr_logger[7])(), 2 < iVar11)) {
      peVar2 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      msg_if_given_abi_cxx11_
                ((string *)&clone,
                 "long pause warning to %d is too verbose, will suppress it from now",
                 (ulong)(uint)((((p->super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>).
                                _M_ptr)->config_).
                               super___shared_ptr<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2>.
                              _M_ptr)->id_);
      (*peVar2->_vptr_logger[8])
                (peVar2,3,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_append_entries.cxx"
                 ,"request_append_entries",0x169,&clone);
      goto LAB_0015d402;
    }
    bVar8 = false;
    goto LAB_0015d40d;
  }
  if ((peVar2 != (element_type *)0x0) && (iVar11 = (*peVar2->_vptr_logger[7])(), 5 < iVar11)) {
    peVar2 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    msg_if_given_abi_cxx11_
              ((string *)&clone,"send request to %d\n",
               (ulong)(uint)((((p->super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>).
                              _M_ptr)->config_).
                             super___shared_ptr<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2>.
                            _M_ptr)->id_);
    (*peVar2->_vptr_logger[8])
              (peVar2,6,
               "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_append_entries.cxx"
               ,"request_append_entries",0x107,&clone);
    std::__cxx11::string::~string((string *)&clone);
  }
  std::__shared_ptr<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&msg.super___shared_ptr<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2>,
             &(((p->super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->rsv_msg_)
              .super___shared_ptr<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2>);
  std::
  function<void_(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>::
  function((function<void_(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>
            *)&clone,
           &((p->super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
            rsv_msg_handler_);
  if (msg.super___shared_ptr<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
      (element_type *)0x0) {
    create_append_entries_req((raft_server *)local_c8,(ptr<peer> *)this);
    std::__shared_ptr<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2>::operator=
              (&msg.super___shared_ptr<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2>,
               (__shared_ptr<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2> *)local_c8);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_c8 + 8));
    std::
    function<void_(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>::
    operator=((function<void_(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>
               *)&clone,&this->resp_handler_);
  }
  else {
    param.myId = 0;
    param.leaderId = 0;
    param.peerId = 0;
    param._12_4_ = 0;
    local_b8._M_allocated_capacity = 0;
    local_b8._8_8_ = (_Invoker_type)0x0;
    local_c8._0_8_ = (void *)0x0;
    local_c8._8_4_ = 0;
    local_c8._12_4_ = 0;
    peer::set_rsv_msg((p->super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>)._M_ptr,
                      (ptr<req_msg> *)&param,(rpc_handler *)local_c8);
    std::_Function_base::~_Function_base((_Function_base *)local_c8);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&param.peerId);
    peVar2 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    if ((peVar2 != (element_type *)0x0) && (iVar11 = (*peVar2->_vptr_logger[7])(), 3 < iVar11)) {
      peVar2 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      msg_if_given_abi_cxx11_
                ((string *)local_c8,"found reserved message to peer %d, type %d",
                 (ulong)(uint)((((p->super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>).
                                _M_ptr)->config_).
                               super___shared_ptr<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2>.
                              _M_ptr)->id_,
                 (ulong)((msg.super___shared_ptr<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                         )->super_msg_base).type_);
      (*peVar2->_vptr_logger[8])
                (peVar2,4,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_append_entries.cxx"
                 ,"request_append_entries",0x110,local_c8);
      std::__cxx11::string::~string((string *)local_c8);
    }
  }
  peVar16 = (p->super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  if (msg.super___shared_ptr<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
      (element_type *)0x0) {
    LOCK();
    (peVar16->busy_flag_)._M_base._M_i = false;
    UNLOCK();
    if ((params.super___shared_ptr<nuraft::raft_params,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
        use_bg_thread_for_snapshot_io_ == true) {
      peer::get_snapshot_sync_ctx((peer *)local_c8);
      uVar7 = local_c8._0_8_;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_c8 + 8));
      if ((void *)uVar7 != (void *)0x0) {
        psVar17 = snapshot_io_mgr::instance();
        snapshot_io_mgr::invoke(psVar17);
      }
    }
  }
  else {
    peVar4 = (p->super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    if (((peVar16->manual_free_)._M_base._M_i & 1U) == 0) {
      if (DAT_001c3524 <= (peVar4->long_pause_warnings_).super___atomic_base<int>._M_i) {
        uVar14 = timer_helper::get_us
                           (&((p->super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>).
                             _M_ptr)->last_sent_timer_);
        LOCK();
        paVar1 = &((p->super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
                  network_recoveries_;
        (paVar1->super___atomic_base<int>)._M_i = (paVar1->super___atomic_base<int>)._M_i + 1;
        UNLOCK();
        peVar2 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        if ((peVar2 != (element_type *)0x0) && (iVar11 = (*peVar2->_vptr_logger[7])(), 2 < iVar11))
        {
          peVar2 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          peVar16 = (p->super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
          msg_if_given_abi_cxx11_
                    ((string *)local_c8,
                     "recovered from long pause to peer %d, %d warnings, %d ms, %d times",
                     (ulong)(uint)((peVar16->config_).
                                   super___shared_ptr<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2>
                                  ._M_ptr)->id_,
                     (ulong)(uint)(peVar16->long_pause_warnings_).super___atomic_base<int>._M_i,
                     uVar14 / 1000 & 0xffffffff,
                     (ulong)(uint)(((p->super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>
                                    )._M_ptr)->network_recoveries_).super___atomic_base<int>._M_i);
          (*peVar2->_vptr_logger[8])
                    (peVar2,3,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_append_entries.cxx"
                     ,"request_append_entries",0x12e,local_c8);
          std::__cxx11::string::~string((string *)local_c8);
        }
        if (9 < (((p->super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
                network_recoveries_).super___atomic_base<int>._M_i) {
          LOCK();
          (((p->super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
          network_recoveries_).super___atomic_base<int>._M_i = 0;
          UNLOCK();
        }
      }
      LOCK();
      (((p->super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
      long_pause_warnings_).super___atomic_base<int>._M_i = 0;
      UNLOCK();
    }
    else {
      LOCK();
      (peVar4->manual_free_)._M_base._M_i = false;
      UNLOCK();
    }
    this_00 = (p->super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    std::__shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_78,&p->super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>);
    peer::send_req(this_00,(ptr<peer> *)&local_78,&msg,(rpc_handler *)&clone);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_78._M_refcount);
    timer_helper::reset(&((p->super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)
                         ->last_sent_timer_);
    param.leaderId = (this->leader_).super___atomic_base<int>._M_i;
    param.myId = this->id_;
    param.peerId = ((((p->super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
                    config_).super___shared_ptr<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr)->id_;
    param.ctx = msg.super___shared_ptr<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    cb_func::call(&((this->ctx_)._M_t.
                    super___uniq_ptr_impl<nuraft::context,_std::default_delete<nuraft::context>_>.
                    _M_t.
                    super__Tuple_impl<0UL,_nuraft::context_*,_std::default_delete<nuraft::context>_>
                    .super__Head_base<0UL,_nuraft::context_*,_false>._M_head_impl)->cb_func_,
                  SentAppendEntriesReq,&param);
    peVar16 = (this->srv_to_leave_).super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr;
    if ((((peVar16 != (element_type *)0x0) &&
         (((peVar16->config_).super___shared_ptr<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2>.
          _M_ptr)->id_ ==
          ((((p->super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->config_).
           super___shared_ptr<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->id_)) &&
        (this->srv_to_leave_target_idx_ <=
         (msg.super___shared_ptr<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->commit_idx_))
       && (((peVar16->stepping_down_)._M_base._M_i & 1U) == 0)) {
      LOCK();
      (((this->srv_to_leave_).super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
      stepping_down_)._M_base._M_i = true;
      UNLOCK();
      peVar2 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      if (peVar2 == (element_type *)0x0) goto LAB_0015d380;
      iVar11 = (*peVar2->_vptr_logger[7])();
      if (3 < iVar11) {
        peVar2 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        msg_if_given_abi_cxx11_
                  ((string *)local_c8,
                   "srv_to_leave_ %d is safe to be erased from peer list, log idx %lu commit idx %lu, set flag"
                   ,(ulong)(uint)((((this->srv_to_leave_).
                                    super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>.
                                   _M_ptr)->config_).
                                  super___shared_ptr<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2>
                                 ._M_ptr)->id_,
                   (msg.super___shared_ptr<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                   last_log_idx_,
                   (msg.super___shared_ptr<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                   commit_idx_);
        (*peVar2->_vptr_logger[8])
                  (peVar2,4,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_append_entries.cxx"
                   ,"request_append_entries",0x153,local_c8);
        std::__cxx11::string::~string((string *)local_c8);
      }
    }
    peVar2 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    if ((peVar2 != (element_type *)0x0) && (iVar11 = (*peVar2->_vptr_logger[7])(), 5 < iVar11)) {
      peVar2 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      msg_if_given_abi_cxx11_((string *)local_c8,"sent\n");
      (*peVar2->_vptr_logger[8])
                (peVar2,6,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_append_entries.cxx"
                 ,"request_append_entries",0x156,local_c8);
      std::__cxx11::string::~string((string *)local_c8);
    }
  }
LAB_0015d380:
  std::_Function_base::~_Function_base((_Function_base *)&clone);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&msg.super___shared_ptr<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  bVar8 = true;
LAB_0015d40d:
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&params.super___shared_ptr<nuraft::raft_params,_(__gnu_cxx::_Lock_policy)2>._M_refcount
            );
  return bVar8;
}

Assistant:

bool raft_server::request_append_entries(ptr<peer> p) {
    static timer_helper chk_timer(1000*1000);

    // Checking the validity of role first.
    if (role_ != srv_role::leader) {
        // WARNING: We should allow `write_paused_` state for
        //          graceful resignation.
        return false;
    }

    cb_func::Param cb_param(id_, leader_, p->get_id());
    CbReturnCode rc = ctx_->cb_func_.call(cb_func::RequestAppendEntries, &cb_param);
    if (rc == CbReturnCode::ReturnNull) {
        p_wn("by callback, abort request_append_entries");
        return true;
    }

    ptr<raft_params> params = ctx_->get_params();

    if ( params->auto_adjust_quorum_for_small_cluster_ &&
         get_num_voting_members() == 2 &&
         chk_timer.timeout_and_reset() ) {
        // If auto adjust mode is on for 2-node cluster, and
        // the follower is not responding, adjust the quorum.
        size_t num_not_responding_peers = get_not_responding_peers();
        size_t cur_quorum_size = get_quorum_for_commit();
        size_t num_stale_peers = get_num_stale_peers();
        if (cur_quorum_size >= 1) {
            bool do_adjustment = false;
            if (num_not_responding_peers) {
                p_wn("2-node cluster's follower is not responding long time, "
                     "adjust quorum to 1");
                do_adjustment = true;
            } else if (num_stale_peers) {
                p_wn("2-node cluster's follower is lagging behind, "
                     "adjust quorum to 1");
                do_adjustment = true;
            }
            if (do_adjustment) {
                ptr<raft_params> clone = cs_new<raft_params>(*params);
                clone->custom_commit_quorum_size_ = 1;
                clone->custom_election_quorum_size_ = 1;
                ctx_->set_params(clone);
            }

        } else if ( num_not_responding_peers == 0 &&
                    num_stale_peers == 0 &&
                    params->custom_commit_quorum_size_ == 1 ) {
            // Recovered, both cases should be clear.
            p_wn("2-node cluster's follower is responding now, "
                 "restore quorum with default value");
            ptr<raft_params> clone = cs_new<raft_params>(*params);
            clone->custom_commit_quorum_size_ = 0;
            clone->custom_election_quorum_size_ = 0;
            ctx_->set_params(clone);
        }
    }

    bool need_to_reconnect = p->need_to_reconnect();
    int32 last_active_time_ms = p->get_active_timer_us() / 1000;
    if ( last_active_time_ms >
             params->heart_beat_interval_ *
                 raft_server::raft_limits_.reconnect_limit_ ) {
        if (srv_to_leave_ && srv_to_leave_->get_id() == p->get_id()) {
            // We should not re-establish the connection to
            // to-be-removed server, as it will block removing it
            // from `peers_` list.
            p_wn( "connection to peer %d is not active long time: %d ms, "
                  "but this peer should be removed. do nothing",
                  p->get_id(),
                  last_active_time_ms );
        } else {
            p_wn( "connection to peer %d is not active long time: %d ms, "
                  "force re-connect",
                  p->get_id(),
                  last_active_time_ms );
            need_to_reconnect = true;
            p->reset_active_timer();
        }
    }
    if (need_to_reconnect) {
        bool reconnected = reconnect_client(*p);
        uint64_t p_next_log_idx = p->get_next_log_idx();
        if (reconnected && p_next_log_idx) {
            // NOTE:
            //   Discussions in https://github.com/eBay/NuRaft/issues/181
            //
            //   The leader keeps the last sent log info for each peer
            //   and sends the next `append_entries` request based on
            //   that data. This process disrupts offline data change,
            //   such as snapshot install, as the leader's peer info
            //   remains unchanged and results in wrong decisions. The
            //   right way to do this is to remove the node, install
            //   the snapshot, and then add the node back.
            //
            //   To avoid those hassles, we can reset the peer info that
            //   the leader has. Once any disconnection happens to a
            //   peer, we reset the last sent log info. The log info will
            //   be re-adjusted by the first `append_entries`
            //   communication between the leader and the peer. It will
            //   eventually have the same impact of removing and then
            //   re-adding the peer.
            //
            p_tr("new rpc for peer %d is created, "
                 "reset next log idx (%" PRIu64 ") and matched log idx (%" PRIu64 ")",
                 p->get_id(), p_next_log_idx, p->get_matched_idx());
            p->set_next_log_idx(0);
            p->set_matched_idx(0);
        }
        p->clear_reconnection();
    }

    if (params->use_bg_thread_for_snapshot_io_) {
        // Check the current queue if previous request exists.
        if (snapshot_io_mgr::instance().has_pending_request(this, p->get_id())) {
            p_tr( "previous snapshot request for peer %d already exists",
                  p->get_id() );
            return true;
        }
    }

    if (p->make_busy()) {
        p_tr("send request to %d\n", (int)p->get_id());

        // If reserved message exists, process it first.
        ptr<req_msg> msg = p->get_rsv_msg();
        rpc_handler m_handler = p->get_rsv_msg_handler();
        if (msg) {
            // Clear the reserved message.
            p->set_rsv_msg(nullptr, nullptr);
            p_in("found reserved message to peer %d, type %d",
                 p->get_id(), msg->get_type());

        } else {
            // Normal message.
            msg = create_append_entries_req(p);
            m_handler = resp_handler_;
        }

        if (!msg) {
            // Even normal message doesn't exist.
            p->set_free();
            if ( params->use_bg_thread_for_snapshot_io_ &&
                 p->get_snapshot_sync_ctx() ) {
                // If this is an async snapshot request, invoke IO thread.
                snapshot_io_mgr::instance().invoke();
            }
            return true;
        }

        if (!p->is_manual_free()) {
            // Actual recovery.
            if ( p->get_long_puase_warnings() >=
                     raft_server::raft_limits_.warning_limit_ ) {
                int32 last_ts_ms = p->get_ls_timer_us() / 1000;
                p->inc_recovery_cnt();
                p_wn( "recovered from long pause to peer %d, %d warnings, "
                      "%d ms, %d times",
                      p->get_id(),
                      p->get_long_puase_warnings(),
                      last_ts_ms,
                      p->get_recovery_cnt() );

                if (p->get_recovery_cnt() >= 10) {
                    // Re-connect client, just in case.
                    //reconnect_client(*p);
                    p->reset_recovery_cnt();
                }
            }
            p->reset_long_pause_warnings();

        } else {
            // FIXME: `manual_free` is deprecated, need to get rid of it.

            // It means that this is not an actual recovery,
            // but just temporarily freed busy flag.
            p->reset_manual_free();
        }

        p->send_req(p, msg, m_handler);
        p->reset_ls_timer();

        cb_func::Param param(id_, leader_, p->get_id(), msg.get());
        ctx_->cb_func_.call(cb_func::SentAppendEntriesReq, &param);

        if ( srv_to_leave_ &&
             srv_to_leave_->get_id() == p->get_id() &&
             msg->get_commit_idx() >= srv_to_leave_target_idx_ &&
             !srv_to_leave_->is_stepping_down() ) {
            // If this is the server to leave, AND
            // current request's commit index includes
            // the target log index number, step down and remove it
            // as soon as we get the corresponding response.
            srv_to_leave_->step_down();
            p_in("srv_to_leave_ %d is safe to be erased from peer list, "
                 "log idx %" PRIu64 " commit idx %" PRIu64 ", set flag",
                 srv_to_leave_->get_id(),
                 msg->get_last_log_idx(),
                 msg->get_commit_idx());
        }

        p_tr("sent\n");
        return true;
    }

    p_db("Server %d is busy, skip the request", p->get_id());
    check_snapshot_timeout(p);

    int32 last_ts_ms = p->get_ls_timer_us() / 1000;
    if ( last_ts_ms > params->heart_beat_interval_ ) {
        // Waiting time becomes longer than HB interval, warning.
        p->inc_long_pause_warnings();
        if (p->get_long_puase_warnings() < raft_server::raft_limits_.warning_limit_) {
            p_wn("skipped sending msg to %d too long time, "
                 "last msg sent %d ms ago",
                 p->get_id(), last_ts_ms);

        } else if ( p->get_long_puase_warnings() ==
                        raft_server::raft_limits_.warning_limit_ ) {
            p_wn("long pause warning to %d is too verbose, "
                 "will suppress it from now", p->get_id());
        }
    }
    return false;
}